

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::ProcessorInstance::ProcessorInstance(ProcessorInstance *this,CodeLocation *l)

{
  CodeLocation local_28;
  CodeLocation *local_18;
  CodeLocation *l_local;
  ProcessorInstance *this_local;
  
  local_18 = l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_28,l);
  Object::Object(&this->super_Object,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__ProcessorInstance_0058b5f8;
  std::__cxx11::string::string((string *)&this->instanceName);
  std::__cxx11::string::string((string *)&this->sourceName);
  this->arraySize = 1;
  ClockMultiplier::ClockMultiplier(&this->clockMultiplier);
  return;
}

Assistant:

ProcessorInstance (CodeLocation l) : Object (std::move (l)) {}